

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

void __thiscall
soul::heart::Parser::scanBlocks(Parser *this,FunctionParseState *state,FunctionBuilder *builder)

{
  pointer pBVar1;
  Module *pMVar2;
  char *__s1;
  Identifier nm;
  bool bVar3;
  int iVar4;
  PoolItem *pPVar5;
  pointer pBVar6;
  Identifier *in_R9;
  Identifier name;
  CodeLocation paramLocation;
  Identifier paramName;
  Type paramType;
  Identifier local_b8;
  Role local_ac;
  CodeLocation local_a8;
  vector<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>
  *local_98;
  FunctionBuilder *local_90;
  FunctionParseState *local_88;
  void **local_80;
  pool_ref<soul::heart::Variable> local_78;
  Identifier local_70;
  CompileMessage local_68;
  
  local_98 = &state->blocks;
  local_90 = builder;
  local_88 = state;
  do {
    local_b8 = parseBlockName(this);
    pBVar1 = (local_88->blocks).
             super__Vector_base<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pBVar6 = (local_88->blocks).
                  super__Vector_base<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>
                  ._M_impl.super__Vector_impl_data._M_start; nm.name = local_b8.name,
        pBVar6 != pBVar1; pBVar6 = pBVar6 + 1) {
      if ((pBVar6->block->name).name == local_b8.name) {
        CompileMessageHelpers::createMessage<soul::Identifier&>
                  (&local_68,(CompileMessageHelpers *)0x1,none,0x284f23,(char *)&local_b8,in_R9);
        (*(this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          )._vptr_Tokeniser[2])(this,&local_68);
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_68.location.sourceCode.object);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68.description._M_dataplus._M_p != &local_68.description.field_2) {
          operator_delete(local_68.description._M_dataplus._M_p,
                          (ulong)(local_68.description.field_2._M_allocated_capacity + 1));
        }
      }
    }
    pPVar5 = PoolAllocator::allocateSpaceForObject
                       (&((local_90->super_BlockBuilder).module)->allocator->pool,0x78);
    local_80 = &pPVar5->item;
    Block::Block((Block *)local_80,nm);
    pPVar5->destructor =
         PoolAllocator::allocate<soul::heart::Block,_soul::Identifier_&>::anon_class_1_0_00000001::
         __invoke;
    bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x288ebc);
    if ((bVar3) &&
       (bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)0x286aae), !bVar3)) {
      do {
        readValueOrRefType((Type *)&local_68,this);
        local_a8.sourceCode.object =
             (this->
             super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ).location.sourceCode.object;
        if (local_a8.sourceCode.object != (SourceCodeText *)0x0) {
          ((local_a8.sourceCode.object)->super_RefCountedObject).refCount =
               ((local_a8.sourceCode.object)->super_RefCountedObject).refCount + 1;
        }
        local_a8.location.data =
             (this->
             super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ).location.location.data;
        local_70 = parseVariableIdentifier(this);
        pMVar2 = (this->module).object;
        if (pMVar2 == (Module *)0x0) {
          throwInternalCompilerError("object != nullptr","operator->",0x3c);
        }
        local_ac = parameter;
        local_78.object =
             PoolAllocator::
             allocate<soul::heart::Variable,soul::CodeLocation,soul::Type&,soul::Identifier&,soul::heart::Variable::Role>
                       (&pMVar2->allocator->pool,&local_a8,(Type *)&local_68,&local_70,&local_ac);
        std::
        vector<soul::pool_ref<soul::heart::Variable>,std::allocator<soul::pool_ref<soul::heart::Variable>>>
        ::emplace_back<soul::pool_ref<soul::heart::Variable>>
                  ((vector<soul::pool_ref<soul::heart::Variable>,std::allocator<soul::pool_ref<soul::heart::Variable>>>
                    *)&pPVar5[1].item,&local_78);
        bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)0x26375e);
        if (!bVar3) {
          Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::expect<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x286aae);
        }
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_a8.sourceCode.object);
        RefCountedPtr<soul::Structure>::decIfNotNull
                  ((Structure *)local_68.description.field_2._M_allocated_capacity);
      } while (bVar3);
    }
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x262bf0);
    local_68.description._M_dataplus._M_p = (pointer)local_80;
    local_68.description._M_string_length =
         (size_type)
         (this->
         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
         ).location.location.data;
    std::
    vector<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>
    ::emplace_back<soul::FunctionParseState::BlockCode>(local_98,(BlockCode *)&local_68);
    while( true ) {
      skipPastNextOccurrenceOf(this,(TokenType)0x261d5f);
      __s1 = (this->
             super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ).currentType.text;
      if (__s1 == "$blockIdentifier") {
        bVar3 = true;
      }
      else if (__s1 == (char *)0x0) {
        bVar3 = false;
      }
      else {
        iVar4 = strcmp(__s1,"$blockIdentifier");
        bVar3 = iVar4 == 0;
      }
      if (bVar3) break;
      bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matchIf<soul::TokenType>
                        (&this->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ,(TokenType)0x26223a);
      if (bVar3) {
        return;
      }
    }
  } while( true );
}

Assistant:

void scanBlocks (FunctionParseState& state, FunctionBuilder& builder)
    {
        for (;;)
        {
            auto name = parseBlockName();

            for (auto& b : state.blocks)
                if (b.block.name == name)
                    throwError (Errors::nameInUse (name));

            auto& block = builder.createBlock (name);

            if (matchIf (HEARTOperator::openParen))
            {
                if (! matchIf (HEARTOperator::closeParen))
                {
                    for (;;)
                    {
                        auto paramType = readValueOrRefType();
                        auto paramLocation = location;
                        auto paramName = parseVariableIdentifier();
                        block.parameters.push_back (module->allocate<heart::Variable> (std::move (paramLocation), paramType, paramName, heart::Variable::Role::parameter));

                        if (matchIf (HEARTOperator::comma))
                            continue;

                        expect (HEARTOperator::closeParen);
                        break;
                    }
                }
            }

            expect (HEARTOperator::colon);
            state.blocks.push_back ({ block, getCurrentTokeniserPosition() });

            skipPastNextOccurrenceOf (HEARTOperator::semicolon);

            while (! matches (Token::blockIdentifier))
            {
                if (matchIf (HEARTOperator::closeBrace))
                    return;

                skipPastNextOccurrenceOf (HEARTOperator::semicolon);
            }
        }
    }